

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int compound_skip_by_single_states
              (AV1_COMP *cpi,InterModeSearchState *search_state,PREDICTION_MODE this_mode,
              MV_REFERENCE_FRAME ref_frame,MV_REFERENCE_FRAME second_ref_frame,MACROBLOCK *x)

{
  int_mv *piVar1;
  byte bVar2;
  undefined1 uVar3;
  int iVar4;
  byte bVar5;
  int *piVar6;
  uint *puVar7;
  uint32_t uVar8;
  undefined7 in_register_00000011;
  byte *pbVar9;
  char *pcVar10;
  int_mv *piVar11;
  int *piVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  undefined7 in_register_00000081;
  int iVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  uint32_t uVar22;
  long lVar23;
  int *piVar24;
  char cVar26;
  char cVar27;
  undefined1 auVar25 [16];
  byte local_bf;
  byte local_be [2];
  int local_bc;
  MV_REFERENCE_FRAME (*local_b8) [4] [4];
  MACROBLOCK *local_b0;
  int local_a8 [2];
  int local_a0 [3];
  uint local_94;
  InterModeSearchState *local_90;
  undefined8 local_80;
  int local_70;
  int local_6c;
  SingleInterModeState (*local_68) [4] [4];
  AV1_COMP *local_60;
  char *local_50;
  char *local_48;
  
  local_b0 = x;
  uVar21 = CONCAT71(in_register_00000011,this_mode) & 0xffffffff;
  local_94 = (uint)(byte)compound_ref0_mode_lut[uVar21];
  local_a0[2] = (uint)(byte)compound_ref1_mode_lut[uVar21];
  local_6c = (byte)compound_ref0_mode_lut[uVar21] - 0xd;
  local_70 = (byte)compound_ref1_mode_lut[uVar21] - 0xd;
  uVar16 = (uint)(byte)ref_frame;
  local_b8 = (MV_REFERENCE_FRAME (*) [4] [4])CONCAT44(local_b8._4_4_,uVar16);
  local_a0[0] = 0;
  local_a0[1] = 0;
  local_a8[0] = 1;
  local_bc = 1;
  local_be[0] = ref_frame;
  local_bf = second_ref_frame;
  local_48 = compound_ref1_mode_lut + uVar21;
  auVar25[0] = -('\x04' < ref_frame);
  cVar26 = -('\0' < (char)in_register_00000081);
  cVar27 = -('\0' < (char)((uint7)in_register_00000081 >> 8));
  auVar25._8_8_ = (undefined8)(((unkuint9)0 << 0x10) >> 8);
  auVar25[7] = cVar27;
  auVar25[6] = cVar27;
  auVar25[5] = cVar26;
  auVar25[4] = cVar26;
  auVar25[3] = -('\x04' < second_ref_frame);
  auVar25[2] = -('\x04' < second_ref_frame);
  auVar25[1] = auVar25[0];
  auVar25 = pshuflw(auVar25,auVar25,0xd4);
  local_50 = compound_ref0_mode_lut + uVar21;
  local_80 = auVar25._0_8_ & (ulong)DAT_00504ce0;
  local_68 = search_state->single_state;
  piVar6 = local_a0;
  piVar12 = (int *)&local_80;
  piVar17 = &local_6c;
  pbVar9 = local_be;
  bVar14 = true;
  do {
    bVar19 = bVar14;
    lVar13 = (long)search_state->single_state_cnt[*piVar12][*piVar17];
    if (0 < lVar13) {
      lVar23 = 0;
      do {
        if ((&search_state->single_state[*piVar12][*piVar17][0].ref_frame)[lVar23] == *pbVar9) {
          *piVar6 = 1;
          break;
        }
        lVar23 = lVar23 + 0x10;
      } while (lVar13 * 0x10 != lVar23);
    }
    piVar6 = local_a0 + 1;
    piVar12 = (int *)((long)&local_80 + 4);
    piVar17 = &local_70;
    pbVar9 = &local_bf;
    bVar14 = false;
  } while (bVar19);
  local_90 = search_state;
  local_60 = cpi;
  iVar4 = get_drl_refmv_count(x,(MV_REFERENCE_FRAME *)(ulong)uVar16,second_ref_frame);
  bVar5 = (second_ref_frame * '\x04' + ref_frame) - 0xd;
  uVar20 = (uint)bVar5;
  if (second_ref_frame < '\x01') {
    uVar20 = uVar16;
  }
  pbVar9 = local_be;
  puVar7 = &local_94;
  piVar6 = local_a0;
  piVar12 = local_a8;
  bVar14 = true;
  do {
    bVar19 = bVar14;
    if (*piVar6 != 0) {
      uVar16 = *puVar7;
      if (0xfffffffd < uVar16 - 0xf && 0 < iVar4) {
        bVar2 = *pbVar9;
        local_b8 = (MV_REFERENCE_FRAME (*) [4] [4])(ulong)bVar2;
        piVar1 = (x->mbmi_ext).global_mvs + (char)bVar2;
        pcVar10 = local_48;
        if (bVar19) {
          pcVar10 = local_50;
        }
        cVar26 = *pcVar10;
        iVar18 = 0;
        do {
          piVar11 = piVar1;
          if (compound_ref0_mode_lut[uVar16] == '\x0f') {
LAB_0021aa5c:
            uVar22 = piVar11->as_int;
          }
          else {
            uVar22 = 0x80008000;
            if (compound_ref0_mode_lut[uVar16] != '\x10') {
              uVar15 = iVar18 + 1;
              if ((0xa2000UL >> ((byte)uVar16 & 0x3f) & 1) != 0) {
                uVar15 = 0;
              }
              if (uVar15 < (local_b0->mbmi_ext).ref_mv_count[bVar2]) {
                piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar2][uVar15].this_mv;
              }
              goto LAB_0021aa5c;
            }
          }
          piVar11 = piVar1;
          if (cVar26 == '\x0f') {
LAB_0021aaf4:
            uVar8 = piVar11->as_int;
          }
          else {
            uVar8 = 0x80008000;
            if (cVar26 != '\x10') {
              uVar21 = (ulong)uVar20;
              if ('\0' < second_ref_frame && ((byte)second_ref_frame < 5 || '\x04' < ref_frame)) {
                lVar13 = 0;
                do {
                  if (((&comp_ref0_lut)[lVar13] == ref_frame) &&
                     ((&comp_ref1_lut)[lVar13] == second_ref_frame)) {
                    uVar21 = (ulong)(byte)((char)lVar13 + 0x14);
                    goto LAB_0021aaa6;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 9);
                uVar21 = (ulong)bVar5;
              }
LAB_0021aaa6:
              uVar15 = iVar18 + 1;
              if (cVar26 == '\r') {
                uVar15 = 0;
              }
              if (uVar15 < (local_b0->mbmi_ext).ref_mv_count[uVar21]) {
                uVar21 = (ulong)(uint)((int)uVar21 << 5);
                if (bVar19) {
                  piVar11 = (int_mv *)
                            ((long)&(x->mbmi_ext).ref_mv_stack[0][uVar15].this_mv + uVar21);
                }
                else {
                  piVar11 = (int_mv *)
                            ((long)&(x->mbmi_ext).ref_mv_stack[0][uVar15].comp_mv + uVar21);
                }
              }
              goto LAB_0021aaf4;
            }
          }
          if (uVar22 != uVar8) {
            *piVar12 = 0;
            break;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
    }
    piVar12 = &local_bc;
    piVar6 = local_a0 + 1;
    puVar7 = (uint *)(local_a0 + 2);
    pbVar9 = &local_bf;
    bVar14 = false;
  } while (bVar19);
  local_b0 = (MACROBLOCK *)local_90->single_state_modelled;
  local_b8 = local_90->single_rd_order;
  piVar6 = (int *)&local_80;
  piVar12 = local_a8;
  puVar7 = &local_94;
  piVar17 = local_a0;
  pbVar9 = local_be;
  piVar24 = &local_6c;
  bVar14 = true;
  do {
    if ((*piVar17 != 0) && (*piVar12 != 0)) {
      lVar13 = (long)*piVar6;
      bVar5 = (byte)*puVar7;
      lVar23 = 0;
      do {
        if (*(char *)((long)local_90->single_state_modelled_cnt[lVar13 + -2] +
                     lVar23 + (ulong)bVar5 * 4 + 0xc) == -1) goto LAB_0021ac0e;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      lVar23 = 4;
LAB_0021ac0e:
      uVar20 = (uint)lVar23;
      uVar16 = 2;
      if (uVar20 < 2) {
        uVar16 = uVar20;
      }
      iVar4 = (local_60->sf).inter_sf.prune_comp_search_by_single_result;
      if (1 < iVar4) {
        uVar20 = uVar16;
      }
      if (2 < iVar4) {
        if (((local_68[lVar13 + -4][(ulong)bVar5 + 3][0].rd != 0x7fffffffffffffff) &&
            ((*(SingleInterModeState (*) [4] [4])((long)local_b0 + (lVar13 + -4) * 0x100))
             [(ulong)bVar5 + 3][0].rd != 0x7fffffffffffffff)) &&
           (uVar20 = uVar16,
           local_68[lVar13 + -4][(ulong)bVar5 + 3][0].ref_frame ==
           (*(SingleInterModeState (*) [4] [4])((long)local_b0 + (lVar13 + -4) * 0x100))
           [(ulong)bVar5 + 3][0].ref_frame)) {
          uVar20 = 1;
        }
        if ((bVar5 & 0xfe) == 0xe) {
          uVar20 = 1;
        }
      }
      uVar16 = 1;
      if ((int)uVar20 < 1) {
        uVar16 = uVar20;
      }
      if (iVar4 < 4) {
        uVar16 = uVar20;
      }
      if ((int)uVar16 < 1) {
        return 1;
      }
      uVar21 = 0;
      while (*pbVar9 != local_90->single_rd_order[lVar13][*piVar24][uVar21]) {
        uVar21 = uVar21 + 1;
        if (uVar16 == uVar21) {
          return 1;
        }
      }
    }
    piVar12 = &local_bc;
    piVar6 = (int *)((long)&local_80 + 4);
    uVar3 = !bVar14;
    puVar7 = (uint *)(local_a0 + 2);
    piVar17 = local_a0 + 1;
    pbVar9 = &local_bf;
    piVar24 = &local_70;
    bVar14 = false;
    if ((bool)uVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

static int compound_skip_by_single_states(
    const AV1_COMP *cpi, const InterModeSearchState *search_state,
    const PREDICTION_MODE this_mode, const MV_REFERENCE_FRAME ref_frame,
    const MV_REFERENCE_FRAME second_ref_frame, const MACROBLOCK *x) {
  const MV_REFERENCE_FRAME refs[2] = { ref_frame, second_ref_frame };
  const int mode[2] = { compound_ref0_mode(this_mode),
                        compound_ref1_mode(this_mode) };
  const int mode_offset[2] = { INTER_OFFSET(mode[0]), INTER_OFFSET(mode[1]) };
  const int mode_dir[2] = { refs[0] <= GOLDEN_FRAME ? 0 : 1,
                            refs[1] <= GOLDEN_FRAME ? 0 : 1 };
  int ref_searched[2] = { 0, 0 };
  int ref_mv_match[2] = { 1, 1 };
  int i, j;

  for (i = 0; i < 2; ++i) {
    const SingleInterModeState *state =
        search_state->single_state[mode_dir[i]][mode_offset[i]];
    const int state_cnt =
        search_state->single_state_cnt[mode_dir[i]][mode_offset[i]];
    for (j = 0; j < state_cnt; ++j) {
      if (state[j].ref_frame == refs[i]) {
        ref_searched[i] = 1;
        break;
      }
    }
  }

  const int ref_set = get_drl_refmv_count(x, refs, this_mode);
  for (i = 0; i < 2; ++i) {
    if (!ref_searched[i] || (mode[i] != NEARESTMV && mode[i] != NEARMV)) {
      continue;
    }
    const MV_REFERENCE_FRAME single_refs[2] = { refs[i], NONE_FRAME };
    for (int ref_mv_idx = 0; ref_mv_idx < ref_set; ref_mv_idx++) {
      int_mv single_mv;
      int_mv comp_mv;
      get_this_mv(&single_mv, mode[i], 0, ref_mv_idx, 0, single_refs,
                  &x->mbmi_ext);
      get_this_mv(&comp_mv, this_mode, i, ref_mv_idx, 0, refs, &x->mbmi_ext);
      if (single_mv.as_int != comp_mv.as_int) {
        ref_mv_match[i] = 0;
        break;
      }
    }
  }

  for (i = 0; i < 2; ++i) {
    if (!ref_searched[i] || !ref_mv_match[i]) continue;
    const int candidates =
        compound_skip_get_candidates(cpi, search_state, mode_dir[i], mode[i]);
    const MV_REFERENCE_FRAME *ref_order =
        search_state->single_rd_order[mode_dir[i]][mode_offset[i]];
    int match = 0;
    for (j = 0; j < candidates; ++j) {
      if (refs[i] == ref_order[j]) {
        match = 1;
        break;
      }
    }
    if (!match) return 1;
  }

  return 0;
}